

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O0

void xLearn::write_data(string *filename,string *data)

{
  unsigned_long *actual;
  size_t sVar1;
  char *message;
  AssertionResult gtest_ar;
  uint32 write_len;
  index_t i;
  FILE *file;
  FILE *in_stack_000000a0;
  char *in_stack_00000158;
  char *in_stack_00000160;
  AssertionResult *this;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  AssertHelper in_stack_ffffffffffffffa8;
  Message local_50 [3];
  undefined8 local_38;
  AssertionResult local_30;
  undefined4 local_20;
  uint local_1c;
  FILE *local_18;
  
  std::__cxx11::string::c_str();
  local_18 = (FILE *)OpenFileOrDie(in_stack_00000160,in_stack_00000158);
  for (local_1c = 0; local_1c < 100000; local_1c = local_1c + 1) {
    actual = (unsigned_long *)std::__cxx11::string::c_str();
    sVar1 = std::__cxx11::string::size();
    sVar1 = fwrite(actual,1,sVar1,local_18);
    local_20 = (undefined4)sVar1;
    local_38 = std::__cxx11::string::size();
    this = &local_30;
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
              ((char *)in_stack_ffffffffffffffa8.data_,
               (char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),(uint *)this,
               actual);
    in_stack_ffffffffffffffa7 = testing::AssertionResult::operator_cast_to_bool(this);
    if (!(bool)in_stack_ffffffffffffffa7) {
      testing::Message::Message(local_50);
      message = testing::AssertionResult::failure_message((AssertionResult *)0x14f4f4);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffa8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/reader_test.cc"
                 ,0x3b,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffffa8,local_50);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffa8);
      testing::Message::~Message((Message *)0x14f540);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x14f580);
  }
  Close(in_stack_000000a0);
  return;
}

Assistant:

void write_data(const std::string& filename,
                const std::string& data) {
  FILE* file = OpenFileOrDie(filename.c_str(), "w");
  for (index_t i = 0; i < kNumLines; ++i) {
    uint32 write_len = fwrite(data.c_str(), 1, data.size(), file);
    EXPECT_EQ(write_len, data.size());
  }
  Close(file);
}